

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::FixedFunctionOOB::setup(FixedFunctionOOB *this)

{
  Functions *gl;
  GLenum GVar1;
  GLint GVar2;
  ProgramSources *pPVar3;
  TestError *pTVar4;
  allocator<char> local_31a;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  GLfloat coords [8];
  ShaderProgram program;
  ProgramSources local_e8;
  
  gl = (this->super_ContextReset).m_gl;
  memset(coords,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_319);
  glu::VertexSource::VertexSource((VertexSource *)local_2b0,&local_2f8);
  pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)coords,(ShaderSource *)local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0f);\n}\n"
             ,&local_31a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d8,&local_318);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_2d8);
  glu::ProgramSources::ProgramSources(&local_e8,pPVar3);
  std::__cxx11::string::~string((string *)(local_2d8 + 8));
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)(local_2b0 + 8));
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)coords);
  glu::ShaderProgram::ShaderProgram(&program,gl,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  glu::operator<<((this->super_ContextReset).m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x3d4);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(program.m_program.m_program);
  GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar1,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x3d6);
  coords[4] = 1.0;
  coords[5] = 1.0;
  coords[6] = -1.0;
  coords[7] = 1.0;
  coords[0] = -1.0;
  coords[1] = -1.0;
  coords[2] = 1.0;
  coords[3] = -1.0;
  GVar2 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                    (program.m_program.m_program,"a_position");
  this->m_coordLocation = GVar2;
  GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar1,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x3e1);
  if (this->m_coordLocation != -1) {
    this->m_coordinatesBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"genBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x3e6);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,999);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,coords,0x88e4);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,
                    "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,1000);
    (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"enableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x3e9);
    (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
              (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
    GVar1 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar1,"vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x3ea);
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
             ,0x3e2);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FixedFunctionOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLfloat coords[] =
	{
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,	1.0f,
		-1.0f,	1.0f
	};

	m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(m_coordLocation != (glw::GLint)-1);

	// Load the vertex data
	m_coordinatesBuffer = 0;
	GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
	GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
}